

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiscExpressions.cpp
# Opt level: O1

bool slang::ast::AssertionInstanceExpression::checkAssertionArg
               (PropertyExprSyntax *propExpr,AssertionPortSymbol *formal,ASTContext *context,
               ActualArg *result,bool isRecursiveProp)

{
  bool bVar1;
  int iVar2;
  type expr;
  int *piVar3;
  Type *this;
  Expression *pEVar4;
  undefined4 extraout_var_00;
  ValueSymbol *this_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Diagnostic *pDVar5;
  socklen_t extraout_EDX;
  socklen_t extraout_EDX_00;
  socklen_t __len;
  int *piVar6;
  SimpleSequenceExprSyntax *simpSeq;
  int *piVar7;
  DiagCode code;
  SourceRange SVar8;
  ASTContext ctx;
  Expression *local_70;
  ASTContext local_68;
  undefined4 extraout_var;
  
  if ((propExpr->super_SyntaxNode).kind == SimplePropertyExpr) {
    piVar7 = *(int **)&propExpr[1].super_SyntaxNode;
    if ((*piVar7 != 0x1b1) || (*(long *)(piVar7 + 8) != 0)) goto LAB_00437ad9;
    piVar6 = *(int **)(piVar7 + 6);
  }
  else {
    piVar7 = (int *)0x0;
LAB_00437ad9:
    piVar6 = (int *)0x0;
  }
  local_68.assertionInstance = context->assertionInstance;
  local_68.scope.ptr = (context->scope).ptr;
  local_68.lookupIndex = context->lookupIndex;
  local_68._12_4_ = *(undefined4 *)&context->field_0xc;
  local_68.flags.m_bits = (context->flags).m_bits;
  local_68.instanceOrProc = context->instanceOrProc;
  local_68.firstTempVar = context->firstTempVar;
  local_68.randomizeDetails = context->randomizeDetails;
  if ((isRecursiveProp) &&
     ((formal->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>._M_payload
      .super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged == false)) {
    piVar3 = piVar6;
    if (piVar6 != (int *)0x0) {
      for (; *piVar3 == 0x167; piVar3 = *(int **)(piVar3 + 10)) {
      }
      if (*piVar3 == 0xe5) goto LAB_00437b36;
    }
    local_68.flags.m_bits = local_68.flags.m_bits | 0x800000;
  }
LAB_00437b36:
  this = DeclaredType::getType(&formal->declaredType);
  __len = extraout_EDX;
  if (this->canonical == (Type *)0x0) {
    Type::resolveCanonical(this);
    __len = extraout_EDX_00;
  }
  switch((this->canonical->super_Symbol).kind) {
  case EventType:
    iVar2 = TimingControl::bind((int)propExpr,(sockaddr *)&local_68,__len);
    pEVar4 = (Expression *)CONCAT44(extraout_var,iVar2);
    local_70 = pEVar4;
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                 *)result,(TimingControl **)&local_70);
    goto LAB_00437d28;
  default:
    if (piVar6 == (int *)0x0) {
      SVar8 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
      pDVar5 = ASTContext::addDiag(&local_68,(DiagCode)0x20007,SVar8);
LAB_00437d79:
      ast::operator<<(pDVar5,this);
      return false;
    }
    iVar2 = Expression::bind((int)piVar6,(sockaddr *)&local_68,0);
    pEVar4 = (Expression *)CONCAT44(extraout_var_00,iVar2);
    bVar1 = Expression::bad(pEVar4);
    if (bVar1) {
      return false;
    }
    bVar1 = Type::isCastCompatible(this,(pEVar4->type).ptr);
    if (!bVar1) {
      SVar8 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
      pDVar5 = ASTContext::addDiag(&local_68,(DiagCode)0x30007,SVar8);
      pDVar5 = ast::operator<<(pDVar5,(pEVar4->type).ptr);
      goto LAB_00437d79;
    }
    if ((((formal->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
          _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>._M_engaged != true)
        || (1 < (formal->direction).super__Optional_base<slang::ast::ArgumentDirection,_true,_true>.
                _M_payload.super__Optional_payload_base<slang::ast::ArgumentDirection>._M_payload.
                _M_value - Out)) || (((formal->super_Symbol).parentScope)->thisSym->kind == Checker)
       ) {
LAB_00437c38:
      local_70 = pEVar4;
      std::
      variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
      ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                   *)result,&local_70);
      return true;
    }
    this_00 = (ValueSymbol *)Expression::getSymbolReference(pEVar4,true);
    if ((this_00 != (ValueSymbol *)0x0) && ((this_00->super_Symbol).kind == LocalAssertionVar)) {
      ValueSymbol::addDriver
                (this_00,Procedural,pEVar4,((context->scope).ptr)->thisSym,
                 (bitmask<slang::ast::AssignFlags>)0x40);
      goto LAB_00437c38;
    }
    SVar8 = pEVar4->sourceRange;
    code.subsystem = Expressions;
    code.code = 7;
    break;
  case UntypedType:
    if (piVar6 != (int *)0x0) {
      iVar2 = Expression::bind((int)piVar6,(sockaddr *)&local_68,0x200);
      local_70 = (Expression *)CONCAT44(extraout_var_01,iVar2);
      std::
      variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
      ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                   *)result,&local_70);
      bVar1 = Expression::bad((Expression *)CONCAT44(extraout_var_01,iVar2));
      return !bVar1;
    }
    local_68.flags.m_bits = local_68.flags.m_bits | 0x40000;
    goto LAB_00437d08;
  case SequenceType:
    if (piVar7 != (int *)0x0) {
      iVar2 = AssertionExpr::bind((int)piVar7,(sockaddr *)&local_68,0);
      local_70 = (Expression *)CONCAT44(extraout_var_02,iVar2);
      bVar1 = local_70->kind != Invalid;
      if (bVar1) {
        AssertionExpr::requireSequence((AssertionExpr *)local_70,&local_68);
        std::
        variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
        ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                     *)result,(AssertionExpr **)&local_70);
        return bVar1;
      }
      return bVar1;
    }
    SVar8 = slang::syntax::SyntaxNode::sourceRange(&propExpr->super_SyntaxNode);
    code.subsystem = Expressions;
    code.code = 4;
    break;
  case PropertyType:
LAB_00437d08:
    iVar2 = AssertionExpr::bind((AssertionExpr *)propExpr,(int)&local_68,(sockaddr *)0x0,0);
    pEVar4 = (Expression *)CONCAT44(extraout_var_03,iVar2);
    local_70 = pEVar4;
    std::
    variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
    ::operator=((variant<slang::ast::Expression_const*,slang::ast::AssertionExpr_const*,slang::ast::TimingControl_const*>
                 *)result,(AssertionExpr **)&local_70);
LAB_00437d28:
    return pEVar4->kind != Invalid;
  case ErrorType:
    goto LAB_00437d86;
  }
  ASTContext::addDiag(&local_68,code,SVar8);
LAB_00437d86:
  return false;
}

Assistant:

bool AssertionInstanceExpression::checkAssertionArg(const PropertyExprSyntax& propExpr,
                                                    const AssertionPortSymbol& formal,
                                                    const ASTContext& context, ActualArg& result,
                                                    bool isRecursiveProp) {
    auto [seqExpr, regExpr] = decomposePropExpr(propExpr);

    ASTContext ctx = context;
    if (isRecursiveProp && !formal.isLocalVar()) {
        // For every recursive instance of property q in the declaration of property p,
        // each actual argument expression e of the instance must satisfy at least one
        // of the following conditions:
        // 1. e is itself a formal argument of p.
        // 2. No formal argument of p appears in e.
        // 3. e is bound to a local variable formal argument of q.
        if (!regExpr)
            ctx.flags |= ASTFlags::RecursivePropertyArg;
        else {
            auto expr = regExpr;
            while (expr->kind == SyntaxKind::ParenthesizedExpression)
                expr = expr->as<ParenthesizedExpressionSyntax>().expression;

            // This check filters out cases where the entire argument is a formal argument.
            if (expr->kind != SyntaxKind::IdentifierName)
                ctx.flags |= ASTFlags::RecursivePropertyArg;
        }
    }

    auto& type = formal.declaredType.getType();
    switch (type.getCanonicalType().kind) {
        case SymbolKind::UntypedType:
            // Untyped formals allow everything. Bind here just so we notice things like
            // name resolution errors even if the argument ends up being unused in the
            // body of the sequence / property.
            if (regExpr) {
                auto& bound = Expression::bind(*regExpr, ctx, ASTFlags::AllowUnboundedLiteral);
                result = &bound;
                return !bound.bad();
            }
            else {
                ctx.flags |= ASTFlags::AssertionInstanceArgCheck;
                auto& bound = AssertionExpr::bind(propExpr, ctx);
                result = &bound;
                return !bound.bad();
            }
        case SymbolKind::SequenceType: {
            if (!seqExpr) {
                ctx.addDiag(diag::AssertionArgTypeSequence, propExpr.sourceRange());
                return false;
            }

            auto& bound = AssertionExpr::bind(*seqExpr, ctx);
            if (bound.bad())
                return false;

            bound.requireSequence(ctx);
            result = &bound;
            return true;
        }
        case SymbolKind::PropertyType: {
            auto& bound = AssertionExpr::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::EventType: {
            auto& bound = TimingControl::bind(propExpr, ctx);
            result = &bound;
            return !bound.bad();
        }
        case SymbolKind::ErrorType:
            return false;
        default:
            break;
    }

    // For all other types, we need a normal expression that
    // is cast compatible with the target type.
    if (!regExpr) {
        ctx.addDiag(diag::AssertionArgNeedsRegExpr, propExpr.sourceRange()) << type;
        return false;
    }

    auto& bound = Expression::bind(*regExpr, ctx);
    if (bound.bad())
        return false;

    if (!type.isCastCompatible(*bound.type)) {
        ctx.addDiag(diag::AssertionArgTypeMismatch, propExpr.sourceRange()) << *bound.type << type;
        return false;
    }

    auto formalParent = formal.getParentScope();
    SLANG_ASSERT(formalParent);

    // Local var formals that are output or inout must bind only to another local var.
    if ((formal.direction == ArgumentDirection::InOut ||
         formal.direction == ArgumentDirection::Out) &&
        formalParent->asSymbol().kind != SymbolKind::Checker) {
        auto sym = bound.getSymbolReference();
        if (!sym || sym->kind != SymbolKind::LocalAssertionVar) {
            ctx.addDiag(diag::AssertionOutputLocalVar, bound.sourceRange);
            return false;
        }

        sym->as<ValueSymbol>().addDriver(DriverKind::Procedural, bound, context.scope->asSymbol(),
                                         AssignFlags::AssertionLocalVarFormalArg);
    }

    result = &bound;
    return true;
}